

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfDeque.c
# Opt level: O2

void * sbfDeque_popBack(sbfDeque dq)

{
  undefined8 *data;
  sbfDequeItemImpl *psVar1;
  sbfDequeItemImpl **ppsVar2;
  anon_struct_16_2_4dd83919_for_mListEntry *paVar3;
  void *pvVar4;
  
  data = (undefined8 *)(dq->mList).tqh_last[1]->mPointer;
  if (data == (undefined8 *)0x0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = (void *)*data;
    psVar1 = (sbfDequeItemImpl *)data[1];
    ppsVar2 = (sbfDequeItemImpl **)data[2];
    paVar3 = &psVar1->mListEntry;
    if (psVar1 == (sbfDequeItemImpl *)0x0) {
      paVar3 = (anon_struct_16_2_4dd83919_for_mListEntry *)&dq->mList;
    }
    paVar3->tqe_prev = ppsVar2;
    *ppsVar2 = psVar1;
    sbfPool_put(data);
  }
  return pvVar4;
}

Assistant:

void*
sbfDeque_popBack (sbfDeque dq)
{
    sbfDequeItem dqe;
    void*        vp;

    dqe = TAILQ_LAST (&dq->mList, sbfDequeItemListImpl);
    if (dqe == NULL)
        return NULL;
    vp = dqe->mPointer;

    TAILQ_REMOVE (&dq->mList, dqe, mListEntry);
    sbfPool_put (dqe);

    return vp;
}